

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
::_update_barcode(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
                  *this,Pos_index birth)

{
  Dictionary *this_00;
  Pos_index *pPVar1;
  mapped_type *__args;
  key_type local_14;
  
  this_00 = &(this->super_Chain_vine_swap_option).super_type.
             super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
             .indexToBar_;
  __args = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this_00,&local_14);
  *(Pos_index *)&__args->_M_node[1]._M_prev =
       (this->super_Chain_vine_swap_option).super_type.
       super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
       .nextPosition_;
  std::
  unordered_map<unsigned_int,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>>
  ::
  try_emplace<std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            ((unordered_map<unsigned_int,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>>
              *)this_00,
             &(this->super_Chain_vine_swap_option).super_type.
              super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
              .nextPosition_,__args);
  pPVar1 = &(this->super_Chain_vine_swap_option).super_type.
            super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
            .nextPosition_;
  *pPVar1 = *pPVar1 + 1;
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_update_barcode(Pos_index birth)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      auto& barIt = _indexToBar().at(birth);
      barIt->death = _nextPosition();
      _indexToBar().try_emplace(_nextPosition(), barIt);  // list so iterators are stable
    } else {
      _barcode()[_indexToBar()[birth]].death = _nextPosition();
      _indexToBar().push_back(_indexToBar()[birth]);
    }
    ++_nextPosition();
  }
}